

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O0

void Saig_ManFoldConstrTest(Aig_Man_t *pAig)

{
  int nSize;
  Aig_Man_t *p;
  Vec_Int_t *p_00;
  Aig_Man_t *pMan;
  Vec_Int_t *vConstrs;
  Aig_Man_t *pAig2;
  Aig_Man_t *pAig1;
  Aig_Man_t *pAig_local;
  
  p = Saig_ManDupUnfoldConstrs(pAig);
  nSize = Saig_ManPoNum(p);
  p_00 = Vec_IntStartNatural(nSize);
  Vec_IntRemove(p_00,0);
  pMan = Saig_ManDupFoldConstrs(p,p_00);
  Vec_IntFree(p_00);
  Ioa_WriteAiger(pMan,"test.aig",0,0);
  Aig_ManStop(p);
  Aig_ManStop(pMan);
  return;
}

Assistant:

void Saig_ManFoldConstrTest( Aig_Man_t * pAig )
{
    Aig_Man_t * pAig1, * pAig2;
    Vec_Int_t * vConstrs;
    // unfold constraints
    pAig1 = Saig_ManDupUnfoldConstrs( pAig );
    // create the constraint list
    vConstrs = Vec_IntStartNatural( Saig_ManPoNum(pAig1) );
    Vec_IntRemove( vConstrs, 0 );
    // fold constraints back
    pAig2 = Saig_ManDupFoldConstrs( pAig1, vConstrs );
    Vec_IntFree( vConstrs );
    // compare the two AIGs
    Ioa_WriteAiger( pAig2, "test.aig", 0, 0 );
    Aig_ManStop( pAig1 );
    Aig_ManStop( pAig2 );
}